

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FM.cpp
# Opt level: O0

void __thiscall
GainContainer::GainContainer
          (GainContainer *this,Hypergraph *hypergraph,Partitionment *partitionment)

{
  CellsInPartitions this_00;
  bool bVar1;
  PartId PVar2;
  PartId PVar3;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *pvVar4;
  size_type sVar5;
  const_reference this_01;
  reference puVar6;
  reference pvVar7;
  reference pvVar8;
  reference this_02;
  value_type local_b8;
  uint local_a4;
  const_iterator cStack_a0;
  uint net_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  value_type *__range2_1;
  int gain;
  PartId cell_part;
  uint cell_1;
  uint cell;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  CellsInPartitions num_cells;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *net;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *__range1;
  uint i;
  uint local_24;
  Partitionment *pPStack_20;
  uint max_gain;
  Partitionment *partitionment_local;
  Hypergraph *hypergraph_local;
  GainContainer *this_local;
  
  pPStack_20 = partitionment;
  partitionment_local = (Partitionment *)hypergraph;
  hypergraph_local = (Hypergraph *)this;
  std::vector<GainContainer::CellState,_std::allocator<GainContainer::CellState>_>::vector
            (&this->cell_states_);
  std::vector<GainBuckets,_std::allocator<GainBuckets>_>::vector(&this->buckets_);
  std::vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>::
  vector(&this->num_cells_in_partitions_);
  local_24 = Hypergraph::getMaxAdjacency((Hypergraph *)partitionment_local);
  for (__range1._0_4_ = 0; (uint)__range1 < 2; __range1._0_4_ = (uint)__range1 + 1) {
    std::vector<GainBuckets,std::allocator<GainBuckets>>::emplace_back<unsigned_int&>
              ((vector<GainBuckets,std::allocator<GainBuckets>> *)&this->buckets_,&local_24);
  }
  pvVar4 = Hypergraph::getNets((Hypergraph *)partitionment_local);
  sVar5 = std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::size(pvVar4);
  std::vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>::
  reserve(&this->num_cells_in_partitions_,sVar5);
  pvVar4 = Hypergraph::getNets((Hypergraph *)partitionment_local);
  __end1 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::begin(pvVar4);
  net = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::end(pvVar4);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                                     *)&net), bVar1) {
    num_cells._M_elems =
         (_Type)__gnu_cxx::
                __normal_iterator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                ::operator*(&__end1);
    memset(&__range2,0,8);
    this_00._M_elems = num_cells._M_elems;
    __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)num_cells._M_elems);
    _cell_1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00._M_elems);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                       *)&cell_1), bVar1) {
      puVar6 = __gnu_cxx::
               __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&__end2);
      PVar2 = Partitionment::operator[](pPStack_20,*puVar6);
      pvVar8 = std::array<unsigned_int,_2UL>::operator[]
                         ((array<unsigned_int,_2UL> *)&__range2,(ulong)PVar2);
      *pvVar8 = *pvVar8 + 1;
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::operator++(&__end2);
    }
    std::vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>::
    push_back(&this->num_cells_in_partitions_,(value_type *)&__range2);
    __gnu_cxx::
    __normal_iterator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
    ::operator++(&__end1);
  }
  pvVar4 = Hypergraph::getCells((Hypergraph *)partitionment_local);
  sVar5 = std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::size(pvVar4);
  std::vector<GainContainer::CellState,_std::allocator<GainContainer::CellState>_>::reserve
            (&this->cell_states_,sVar5);
  gain = 0;
  while( true ) {
    pvVar4 = Hypergraph::getCells((Hypergraph *)partitionment_local);
    sVar5 = std::
            vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ::size(pvVar4);
    if (sVar5 <= (uint)gain) break;
    PVar2 = Partitionment::operator[](pPStack_20,gain);
    __range2_1._0_4_ = 0;
    pvVar4 = Hypergraph::getCells((Hypergraph *)partitionment_local);
    this_01 = std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::operator[](pvVar4,(ulong)(uint)gain);
    __end2_1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(this_01);
    cStack_a0 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(this_01);
    while (bVar1 = __gnu_cxx::operator!=(&__end2_1,&stack0xffffffffffffff60), bVar1) {
      puVar6 = __gnu_cxx::
               __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&__end2_1);
      local_a4 = *puVar6;
      pvVar7 = std::
               vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
               ::operator[](&this->num_cells_in_partitions_,(ulong)local_a4);
      pvVar8 = std::array<unsigned_int,_2UL>::operator[](pvVar7,(ulong)PVar2);
      if (*pvVar8 == 1) {
        __range2_1._0_4_ = (int)__range2_1 + 1;
      }
      else {
        pvVar7 = std::
                 vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                 ::operator[](&this->num_cells_in_partitions_,(ulong)local_a4);
        PVar3 = OppositePart(PVar2);
        pvVar8 = std::array<unsigned_int,_2UL>::operator[](pvVar7,(ulong)PVar3);
        if (*pvVar8 == 0) {
          __range2_1._0_4_ = (int)__range2_1 + -1;
        }
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::operator++(&__end2_1);
    }
    this_02 = std::vector<GainBuckets,_std::allocator<GainBuckets>_>::operator[]
                        (&this->buckets_,(ulong)PVar2);
    local_b8.iter = GainBuckets::addCell(this_02,(int)__range2_1,gain);
    local_b8.gain = (int)__range2_1;
    local_b8.locked = false;
    std::vector<GainContainer::CellState,_std::allocator<GainContainer::CellState>_>::push_back
              (&this->cell_states_,&local_b8);
    gain = gain + 1;
  }
  return;
}

Assistant:

GainContainer::GainContainer(const Hypergraph &hypergraph, const Partitionment &partitionment) {
  // create PartitionGains for both parts
  auto max_gain = hypergraph.getMaxAdjacency();
  for (unsigned i = 0; i < 2; ++i)
    buckets_.emplace_back(max_gain);
  // calculate number of cells in each partition for all nets
  num_cells_in_partitions_.reserve(hypergraph.getNets().size());
  for (const auto &net : hypergraph.getNets()) {
    CellsInPartitions num_cells{0, 0};
    for (unsigned cell : net)
      ++num_cells[partitionment[cell]];
    num_cells_in_partitions_.push_back(num_cells);
  }
  // calculate gains for all cells
  cell_states_.reserve(hypergraph.getCells().size());
  for (unsigned cell = 0; cell < hypergraph.getCells().size(); ++cell) {
    auto cell_part = partitionment[cell];
    int gain = 0;
    for (unsigned net : hypergraph.getCells()[cell])
      if (num_cells_in_partitions_[net][cell_part] == 1)
        ++gain;
      else if (num_cells_in_partitions_[net][OppositePart(cell_part)] == 0)
        --gain;
    cell_states_.push_back(CellState{buckets_[cell_part].addCell(gain, cell), gain, false});
  }
}